

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O2

int ERKStepWFtolerances(void *arkode_mem,ARKEwtFn efun)

{
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::ERKStep","ERKStepWFtolerances",
                    "arkode_mem = NULL illegal.");
    return -0x15;
  }
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x250) != 0) {
      *(undefined4 *)((long)arkode_mem + 0x18) = 2;
      *(undefined4 *)((long)arkode_mem + 0x54) = 1;
      *(ARKEwtFn *)((long)arkode_mem + 0x58) = efun;
      *(undefined8 *)((long)arkode_mem + 0x60) = *(undefined8 *)((long)arkode_mem + 0x10);
      return 0;
    }
    msgfmt = "Attempt to call before ARKodeInit.";
    error_code = -0x17;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkWFtolerances",msgfmt);
  return error_code;
}

Assistant:

int ERKStepWFtolerances(void *arkode_mem, ARKEwtFn efun)
{
  /* unpack ark_mem, call arkWFtolerances, and return */
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::ERKStep",
                    "ERKStepWFtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  return(arkWFtolerances(ark_mem, efun));
}